

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O0

unsigned_long
spvtools::utils::SignExtendValue<unsigned_long>(unsigned_long value,uint32_t number_of_bits)

{
  bool bVar1;
  bool is_negative;
  uint32_t bit_width;
  uint32_t number_of_bits_local;
  unsigned_long value_local;
  
  value_local = value;
  if (number_of_bits != 0x40) {
    bVar1 = IsBitAtPositionSet<unsigned_long>(value,(ulong)(number_of_bits - 1));
    if (bVar1) {
      _bit_width = SetHighBits<unsigned_long>(value,(ulong)(0x40 - number_of_bits));
    }
    else {
      _bit_width = ClearHighBits<unsigned_long>(value,(ulong)(0x40 - number_of_bits));
    }
    value_local = _bit_width;
  }
  return value_local;
}

Assistant:

T SignExtendValue(T value, uint32_t number_of_bits) {
  const uint32_t bit_width = sizeof(value) * 8;
  if (number_of_bits == bit_width) return value;

  bool is_negative = utils::IsBitAtPositionSet(value, number_of_bits - 1);
  if (is_negative) {
    value = utils::SetHighBits(value, bit_width - number_of_bits);
  } else {
    value = utils::ClearHighBits(value, bit_width - number_of_bits);
  }
  return value;
}